

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createLoad(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  bool bVar1;
  Type *Ty;
  DefSite *ds_00;
  Value *in_RSI;
  RWNode *in_RDI;
  GenericDefSite<dg::dda::RWNode> *ds;
  iterator __end2;
  iterator __begin2;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  *__range2;
  Value *in_stack_00000048;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  defSites;
  uint64_t size;
  RWNode *node;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  *in_stack_ffffffffffffff78;
  LLVMReadWriteGraphBuilder *in_stack_ffffffffffffff80;
  User *__lhs;
  __normal_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_*,_std::vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>_>
  local_50;
  undefined1 *local_48;
  Offset local_40;
  undefined1 local_38 [24];
  uint64_t local_20;
  RWNode *local_18;
  Value *local_10;
  
  local_10 = in_RSI;
  local_18 = create(in_stack_ffffffffffffff80,(RWNodeType)((ulong)in_stack_ffffffffffffff78 >> 0x20)
                   );
  Ty = llvm::Value::getType(local_10);
  GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::getDataLayout
            ((GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *)0x18d999);
  local_20 = llvmutils::getAllocatedSize(Ty,(DataLayout *)in_RDI);
  if (local_20 == 0) {
    local_20 = Offset::UNKNOWN;
  }
  ds_00 = (DefSite *)
          llvm::User::getOperand((User *)local_10,(uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  Offset::Offset(&local_40,local_20);
  mapPointers((LLVMReadWriteGraphBuilder *)
              defSites.
              super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start,in_stack_00000048,(Value *)__range2,
              (Offset)defSites.
                      super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  local_48 = local_38;
  local_50._M_current =
       (GenericDefSite<dg::dda::RWNode> *)
       std::
       vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
       ::begin(in_stack_ffffffffffffff78);
  std::
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  ::end(in_stack_ffffffffffffff78);
  __lhs = (User *)local_10;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_*,_std::vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>_>
                        *)__lhs,(__normal_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_*,_std::vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>_>
                                 *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_*,_std::vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>_>
    ::operator*(&local_50);
    RWNode::addUse(in_RDI,ds_00);
    __gnu_cxx::
    __normal_iterator<dg::dda::GenericDefSite<dg::dda::RWNode>_*,_std::vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>_>
    ::operator++(&local_50);
  }
  std::
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  ::~vector((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
             *)in_RDI);
  return local_18;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::createLoad(const llvm::Instruction *Inst) {
    RWNode &node = create(RWNodeType::LOAD);

    uint64_t size =
            llvmutils::getAllocatedSize(Inst->getType(), getDataLayout());
    if (size == 0)
        size = Offset::UNKNOWN;

    auto defSites = mapPointers(Inst, Inst->getOperand(0), size);
    for (const auto &ds : defSites) {
        node.addUse(ds);
    }

    return &node;
}